

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolOcclusionTests.cpp
# Opt level: O0

void __thiscall
vkt::QueryPool::anon_unknown_0::
QueryPoolOcclusionTest<vkt::QueryPool::(anonymous_namespace)::BasicOcclusionQueryTestInstance>::
QueryPoolOcclusionTest
          (QueryPoolOcclusionTest<vkt::QueryPool::(anonymous_namespace)::BasicOcclusionQueryTestInstance>
           *this,TestContext *context,char *name,char *description,
          OcclusionQueryTestVector *testVector)

{
  OcclusionQueryResultSize OVar1;
  OcclusionQueryResultsMode OVar2;
  undefined3 uVar3;
  VkPrimitiveTopology VVar4;
  OcclusionQueryTestVector *__s;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  string local_50;
  OcclusionQueryTestVector *local_30;
  OcclusionQueryTestVector *testVector_local;
  char *description_local;
  char *name_local;
  TestContext *context_local;
  QueryPoolOcclusionTest<vkt::QueryPool::(anonymous_namespace)::BasicOcclusionQueryTestInstance>
  *this_local;
  
  local_30 = testVector;
  testVector_local = (OcclusionQueryTestVector *)description;
  description_local = name;
  name_local = (char *)context;
  context_local = (TestContext *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,name,&local_51);
  __s = testVector_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,(char *)__s,&local_89);
  TestCase::TestCase(&this->super_TestCase,context,&local_50,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__QueryPoolOcclusionTest_016acd28;
  OVar1 = local_30->queryResultSize;
  (this->m_testVector).queryControlFlags = local_30->queryControlFlags;
  (this->m_testVector).queryResultSize = OVar1;
  OVar2 = local_30->queryResultsMode;
  (this->m_testVector).queryWait = local_30->queryWait;
  (this->m_testVector).queryResultsMode = OVar2;
  (this->m_testVector).queryResultsStride = local_30->queryResultsStride;
  uVar3 = *(undefined3 *)&local_30->field_0x19;
  VVar4 = local_30->primitiveTopology;
  (this->m_testVector).queryResultsAvailability = local_30->queryResultsAvailability;
  *(undefined3 *)&(this->m_testVector).field_0x19 = uVar3;
  (this->m_testVector).primitiveTopology = VVar4;
  return;
}

Assistant:

QueryPoolOcclusionTest (tcu::TestContext &context, const char *name, const char *description, const OcclusionQueryTestVector& testVector)
		: TestCase			(context, name, description)
		, m_testVector		(testVector)
	{
	}